

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger array_reduce(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQArray *this;
  SQUnsignedInteger SVar2;
  SQObjectPtr *pSVar3;
  SQRESULT SVar4;
  SQObjectPtr *obj;
  SQUnsignedInteger nidx;
  SQInteger local_68;
  SQObjectPtr other;
  SQObjectPtr res;
  SQObjectPtr local_40;
  
  local_68 = 1;
  pSVar3 = stack_get(v,1);
  this = (pSVar3->super_SQObject)._unVal.pArray;
  SVar2 = (this->_values)._size;
  if (SVar2 == 0) {
    local_68 = 0;
  }
  else {
    res.super_SQObject._type = OT_NULL;
    res.super_SQObject._unVal.pTable = (SQTable *)0x0;
    SQArray::Get(this,0,&res);
    if (1 < (long)SVar2) {
      other.super_SQObject._type = OT_NULL;
      other.super_SQObject._unVal.pTable = (SQTable *)0x0;
      for (nidx = 1; SVar2 != nidx; nidx = nidx + 1) {
        SQArray::Get(this,nidx,&other);
        local_40.super_SQObject._type = (pSVar3->super_SQObject)._type;
        local_40.super_SQObject._unVal = (SQObjectValue)(pSVar3->super_SQObject)._unVal.pTable;
        if ((local_40.super_SQObject._type >> 0x1b & 1) != 0) {
          pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        SQVM::Push(v,&local_40);
        SQObjectPtr::~SQObjectPtr(&local_40);
        SQVM::Push(v,&res);
        SQVM::Push(v,&other);
        SVar4 = sq_call(v,3,1,0);
        if (SVar4 < 0) {
          SQObjectPtr::~SQObjectPtr(&other);
          local_68 = -1;
          goto LAB_0012a792;
        }
        obj = SQVM::GetUp(v,-1);
        SQObjectPtr::operator=(&res,obj);
        SQVM::Pop(v);
      }
      SQObjectPtr::~SQObjectPtr(&other);
    }
    SQVM::Push(v,&res);
LAB_0012a792:
    SQObjectPtr::~SQObjectPtr(&res);
  }
  return local_68;
}

Assistant:

static SQInteger array_reduce(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQArray *a = _array(o);
    SQInteger size = a->Size();
    if(size == 0) {
        return 0;
    }
    SQObjectPtr res;
    a->Get(0,res);
    if(size > 1) {
        SQObjectPtr other;
        for(SQInteger n = 1; n < size; n++) {
            a->Get(n,other);
            v->Push(o);
            v->Push(res);
            v->Push(other);
            if(SQ_FAILED(sq_call(v,3,SQTrue,SQFalse))) {
                return SQ_ERROR;
            }
            res = v->GetUp(-1);
            v->Pop();
        }
    }
    v->Push(res);
    return 1;
}